

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layer_switch_Dyy_unconditional_opt
               (response_layer *layer,integral_image *iimage)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  integral_image *piVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int c0;
  float fVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined8 uStack_160;
  float afStack_158 [2];
  long local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  uint local_12c;
  float *local_128;
  bool *local_120;
  int local_114;
  ulong local_110;
  float *local_108;
  undefined1 *local_100;
  ulong local_f8;
  long local_f0;
  integral_image *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  bool *local_b8;
  float *local_b0;
  float *local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  float local_7c;
  long local_78;
  int local_6c;
  ulong local_68;
  long local_60;
  long local_58;
  ulong local_50;
  float local_44;
  int local_40;
  int local_3c;
  int local_38;
  float local_34;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  iVar8 = layer->filter_size;
  iVar7 = iimage->height;
  uVar1 = (long)(iVar8 + -1) / 2;
  uVar10 = uVar1 & 0xffffffff;
  uStack_160 = 3;
  if (iVar8 <= iVar7) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer,iimage);
    return;
  }
  uVar15 = (long)iVar8 / 3 & 0xffffffff;
  uVar5 = iimage->width;
  local_f8 = uVar10;
  iVar6 = (int)uVar1;
  uVar14 = (uint)((long)iVar8 / 3);
  if (iVar7 <= iVar6) {
    iVar16 = layer->height;
    iVar9 = iimage->data_width;
    local_108 = iimage->data;
    local_6c = layer->step;
    local_90 = (long)local_6c;
    local_f0 = CONCAT44(local_f0._4_4_,iVar16);
    local_44 = 1.0 / (float)(iVar8 * iVar8);
    local_128 = layer->response;
    local_120 = layer->laplacian;
    local_98 = uVar15;
    local_e8 = iimage;
    if ((int)uVar14 < (int)uVar5) {
      local_100 = (undefined1 *)afStack_158;
      lVar3 = -((ulong)uVar5 * 4 + 0xf & 0xfffffffffffffff0);
      local_78 = (long)afStack_158 + lVar3;
      iVar6 = layer->width * local_6c;
      iVar9 = (iVar7 + -1) * iVar9;
      iVar12 = (uVar14 - 1) + iVar9;
      iVar7 = iVar9 - uVar14;
      for (lVar11 = 0; lVar11 < (int)(iVar6 - uVar14); lVar11 = lVar11 + local_90) {
        lVar13 = (long)iVar12;
        iVar7 = iVar7 + local_6c;
        iVar12 = iVar12 + local_6c;
        *(float *)(local_78 + lVar11 * 4) = local_108[lVar13];
      }
      fVar17 = local_108[(int)((uVar5 - 1) + iVar9)];
      for (; lVar11 < (int)uVar14; lVar11 = lVar11 + local_90) {
        *(float *)(local_78 + lVar11 * 4) = fVar17;
        iVar7 = iVar7 + local_6c;
      }
      local_58 = (long)iVar6;
      for (; lVar11 < iVar6; lVar11 = lVar11 + local_90) {
        lVar13 = (long)iVar7;
        iVar7 = iVar7 + local_6c;
        *(float *)(local_78 + lVar11 * 4) = fVar17 - local_108[lVar13];
      }
      local_f0 = CONCAT44(local_f0._4_4_,iVar16 * local_6c);
      *(undefined8 *)((long)afStack_158 + lVar3 + -8) = 6;
      local_50 = 0;
      local_b8 = (bool *)(ulong)~(uint)local_f8;
      uVar5 = ~(iVar8 / (int)*(undefined8 *)((long)afStack_158 + lVar3 + -8));
      local_88 = (ulong)uVar5;
      local_b0 = (float *)(ulong)(uVar14 - 2);
      local_a8 = (float *)(ulong)~uVar14;
      local_a0 = (ulong)(uVar5 + uVar14);
      local_110 = 0;
      local_108 = (float *)(ulong)-uVar14;
      while( true ) {
        iVar8 = (int)local_50;
        if ((int)local_f0 <= iVar8) break;
        local_3c = (int)uVar15;
        local_40 = iVar8 + -1 + local_3c;
        local_68 = (ulong)(uint)(iVar8 - local_3c);
        local_110 = (ulong)(int)local_110;
        local_c8 = CONCAT44(local_c8._4_4_,iVar8 + local_3c);
        local_60 = CONCAT44(local_60._4_4_,iVar8 + -1);
        local_6c = (iVar8 - local_3c) - 1;
        uVar5 = (int)local_88 + iVar8;
        local_c0 = (ulong)uVar5;
        local_3c = uVar5 + local_3c;
        for (lVar11 = 0; iVar8 = local_3c, uVar1 = local_c0, piVar4 = local_e8, lVar11 < local_58;
            lVar11 = lVar11 + local_90) {
          iVar7 = (int)lVar11;
          iVar12 = (int)local_98 + iVar7;
          iVar6 = (int)local_108;
          iVar16 = (int)local_b0;
          local_38 = iVar12;
          local_e0._0_4_ = (float)*(uint *)(local_78 + lVar11 * 4);
          local_d8._0_4_ = (float)(iVar7 + -1);
          *(undefined8 *)((long)afStack_158 + lVar3 + -8) = 0x11e7ec;
          auVar21._0_4_ =
               box_integral_unconditional_opt(piVar4,(int)uVar1,iVar6 + iVar7,iVar8,iVar16 + iVar7);
          iVar16 = local_40;
          auVar21._4_60_ = extraout_var_02;
          auVar2 = vfmadd213ss_fma(auVar21._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                   ZEXT416((uint)(float)local_e0));
          local_e0 = CONCAT44(local_e0._4_4_,auVar2._0_4_);
          iVar8 = (int)local_f8;
          iVar6 = (int)local_b8;
          iVar9 = (int)local_68;
          *(undefined8 *)((long)afStack_158 + lVar3 + -8) = 0x11e834;
          fVar17 = box_integral_unconditional_opt(piVar4,iVar9,iVar6 + iVar7,iVar16,iVar8 + iVar7);
          iVar8 = (int)local_88;
          iVar6 = (int)local_a0;
          local_d0._0_4_ = fVar17;
          *(undefined8 *)((long)afStack_158 + lVar3 + -8) = 0x11e85c;
          auVar22._0_4_ =
               box_integral_unconditional_opt(piVar4,iVar9,iVar8 + iVar7,iVar16,iVar6 + iVar7);
          iVar8 = local_6c;
          auVar22._4_60_ = extraout_var_03;
          auVar2 = vfmadd132ss_fma(auVar22._0_16_,ZEXT416((uint)(float)local_d0),ZEXT416(0xc0400000)
                                  );
          local_d0 = CONCAT44(local_d0._4_4_,auVar2._0_4_);
          iVar6 = (int)local_60;
          *(undefined8 *)((long)afStack_158 + lVar3 + -8) = 0x11e889;
          local_34 = box_integral_unconditional_opt(piVar4,iVar8,iVar7,iVar6,iVar12);
          iVar8 = (int)(float)local_d8;
          piVar4 = local_e8;
          iVar6 = (int)(float)local_c8;
          c0 = (int)local_a8 + iVar7;
          iVar12 = (int)local_50;
          *(undefined8 *)((long)afStack_158 + lVar3 + -8) = 0x11e8c2;
          fVar17 = box_integral_unconditional_opt(piVar4,iVar12,c0,iVar6,iVar8);
          iVar16 = local_6c;
          piVar4 = local_e8;
          local_34 = fVar17 + local_34;
          iVar9 = (int)local_60;
          *(undefined8 *)((long)afStack_158 + lVar3 + -8) = 0x11e8eb;
          fVar17 = box_integral_unconditional_opt(piVar4,iVar16,c0,iVar9,iVar8);
          iVar8 = local_38;
          local_d8 = CONCAT44(local_d8._4_4_,local_34 - fVar17);
          *(undefined8 *)((long)afStack_158 + lVar3 + -8) = 0x11e910;
          fVar17 = box_integral_unconditional_opt(piVar4,iVar12,iVar7,iVar6,iVar8);
          fVar17 = local_44 * ((float)local_d8 - fVar17);
          auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar17 * -0.81)),
                                   ZEXT416((uint)(local_44 * (float)local_d0)),
                                   ZEXT416((uint)(local_44 * (float)local_e0)));
          local_128[local_110] = auVar2._0_4_;
          local_120[local_110] = 0.0 <= local_44 * (float)local_e0 + local_44 * (float)local_d0;
          local_110 = local_110 + 1;
        }
        local_50 = (ulong)(uint)((int)local_50 + (int)local_90);
        uVar15 = local_98;
      }
    }
    else {
      local_114 = uVar5 - 1;
      local_7c = local_108[(int)((iVar7 + -1) * iVar9 + -1 + uVar5)];
      local_12c = iVar8 / 6;
      local_6c = layer->width * local_6c;
      local_148 = (ulong)~local_12c;
      local_140 = (ulong)(~local_12c + uVar14);
      local_150 = (long)(int)(local_6c - local_12c);
      iVar8 = 0;
      local_138 = ~uVar15;
      local_110 = (ulong)(uint)-iVar6;
      local_e0 = (ulong)-uVar14;
      local_d8 = (ulong)(uVar14 - local_12c);
      local_d0 = (ulong)-local_12c;
      local_100 = (undefined1 *)CONCAT44(local_100._4_4_,iVar9);
      for (local_60 = 0; local_60 < local_150; local_60 = local_60 + local_90) {
        iVar7 = (int)local_98;
        iVar6 = (int)local_60;
        local_34 = (float)(iVar7 + iVar6);
        local_40 = iVar6 - iVar7;
        auVar2 = vfmadd132ss_fma(ZEXT416((uint)local_108[((int)local_140 + iVar6) * iVar9 +
                                                         local_114]),ZEXT416((uint)local_7c),
                                 ZEXT416(0xc0400000));
        local_c8 = CONCAT44(local_c8._4_4_,auVar2._0_4_ * local_44);
        local_c0 = CONCAT44(local_c0._4_4_,iVar6 + -1);
        local_3c = (int)local_138 + iVar6;
        local_b8 = (bool *)CONCAT44(local_b8._4_4_,iVar7 + -1 + iVar6);
        local_a0 = CONCAT44(local_a0._4_4_,iVar8);
        local_a8 = local_128 + iVar8;
        local_b0 = (float *)(local_120 + iVar8);
        local_78 = 0;
        for (iVar8 = -1; iVar7 = local_40, piVar4 = local_e8, iVar6 = iVar8 + 1, iVar6 < local_6c;
            iVar8 = (int)local_90 + iVar8) {
          local_38 = (int)local_98 + 1 + iVar8;
          iVar16 = (int)local_b8;
          uStack_160 = 0x11e05d;
          local_58._0_4_ = (float)((int)local_e0 + iVar8);
          fVar17 = box_integral_unconditional_opt
                             (local_e8,local_40,(int)local_110 + iVar8,(int)local_b8,
                              (int)uVar10 + 1 + iVar8);
          uStack_160 = 0x11e086;
          local_50._0_4_ = fVar17;
          auVar18._0_4_ =
               box_integral_unconditional_opt
                         (piVar4,iVar7,(int)local_d0 + iVar8,iVar16,(int)local_d8 + iVar8);
          iVar16 = local_3c;
          auVar18._4_60_ = extraout_var;
          auVar2 = vfmadd132ss_fma(auVar18._0_16_,ZEXT416((uint)(float)local_50),ZEXT416(0xc0400000)
                                  );
          local_50 = CONCAT44(local_50._4_4_,auVar2._0_4_);
          local_88 = CONCAT44(local_88._4_4_,iVar6);
          iVar7 = (int)local_c0;
          uStack_160 = 0x11e0bd;
          fVar17 = box_integral_unconditional_opt(piVar4,local_3c,iVar6,(int)local_c0,local_38);
          iVar6 = (int)(float)local_58;
          uStack_160 = 0x11e0db;
          local_68._0_4_ = fVar17;
          fVar17 = box_integral_unconditional_opt
                             (piVar4,(int)local_60,(int)(float)local_58,(int)local_34,iVar8);
          local_68 = CONCAT44(local_68._4_4_,fVar17 + (float)local_68);
          uStack_160 = 0x11e0f9;
          fVar17 = box_integral_unconditional_opt(piVar4,iVar16,iVar6,iVar7,iVar8);
          uVar10 = local_f8;
          local_58 = CONCAT44(local_58._4_4_,(float)local_68 - fVar17);
          uStack_160 = 0x11e124;
          fVar17 = box_integral_unconditional_opt
                             (piVar4,(int)local_60,(int)local_88,(int)local_34,local_38);
          fVar17 = local_44 * ((float)local_58 - fVar17);
          auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar17 * -0.81)),
                                   ZEXT416((uint)(local_44 * (float)local_50)),
                                   ZEXT416((uint)(float)local_c8));
          local_a8[local_78] = auVar2._0_4_;
          *(bool *)((long)local_b0 + local_78) = 0.0 <= (float)local_c8 + local_44 * (float)local_50
          ;
          local_78 = local_78 + 1;
        }
        iVar8 = (int)local_a0 + (int)local_78;
        iVar9 = (int)local_100;
      }
      local_7c = local_7c * -2.0;
      local_a8 = (float *)CONCAT44(local_a8._4_4_,local_7c * local_44);
      for (; iVar7 = (int)local_60, iVar7 <= (int)local_12c; local_60 = local_60 + local_90) {
        iVar6 = (int)local_98;
        local_40 = iVar7 + -1 + iVar6;
        local_34 = (float)(iVar7 + iVar6);
        local_c8 = (ulong)(uint)(iVar7 - iVar6);
        local_c0 = CONCAT44(local_c0._4_4_,iVar7 + -1);
        local_3c = (iVar7 - iVar6) - 1;
        local_a0 = CONCAT44(local_a0._4_4_,iVar8);
        local_b0 = local_128 + iVar8;
        local_b8 = local_120 + iVar8;
        local_78 = 0;
        for (iVar8 = -1; iVar7 = local_40, piVar4 = local_e8, iVar6 = iVar8 + 1, iVar6 < local_6c;
            iVar8 = (int)local_90 + iVar8) {
          local_38 = (int)local_98 + 1 + iVar8;
          iVar16 = (int)local_c8;
          uStack_160 = 0x11e2cd;
          local_58._0_4_ = (float)((int)local_e0 + iVar8);
          fVar17 = box_integral_unconditional_opt
                             (local_e8,iVar16,(int)local_110 + iVar8,local_40,
                              (int)uVar10 + 1 + iVar8);
          uStack_160 = 0x11e2f6;
          local_50._0_4_ = fVar17;
          auVar19._0_4_ =
               box_integral_unconditional_opt
                         (piVar4,iVar16,(int)local_d0 + iVar8,iVar7,(int)local_d8 + iVar8);
          iVar16 = local_3c;
          auVar19._4_60_ = extraout_var_00;
          auVar2 = vfmadd132ss_fma(auVar19._0_16_,ZEXT416((uint)(float)local_50),ZEXT416(0xc0400000)
                                  );
          local_50 = CONCAT44(local_50._4_4_,auVar2._0_4_);
          local_88 = CONCAT44(local_88._4_4_,iVar6);
          iVar7 = (int)local_c0;
          uStack_160 = 0x11e32d;
          fVar17 = box_integral_unconditional_opt(piVar4,local_3c,iVar6,(int)local_c0,local_38);
          iVar6 = (int)(float)local_58;
          uStack_160 = 0x11e34b;
          local_68._0_4_ = fVar17;
          fVar17 = box_integral_unconditional_opt
                             (piVar4,(int)local_60,(int)(float)local_58,(int)local_34,iVar8);
          local_68 = CONCAT44(local_68._4_4_,fVar17 + (float)local_68);
          uStack_160 = 0x11e369;
          fVar17 = box_integral_unconditional_opt(piVar4,iVar16,iVar6,iVar7,iVar8);
          uVar10 = local_f8;
          local_58 = CONCAT44(local_58._4_4_,(float)local_68 - fVar17);
          uStack_160 = 0x11e394;
          fVar17 = box_integral_unconditional_opt
                             (piVar4,(int)local_60,(int)local_88,(int)local_34,local_38);
          fVar17 = local_44 * ((float)local_58 - fVar17);
          auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar17 * -0.81)),
                                   ZEXT416((uint)(local_44 * (float)local_50)),
                                   ZEXT416((uint)local_a8._0_4_));
          local_b0[local_78] = auVar2._0_4_;
          local_b8[local_78] = 0.0 <= local_a8._0_4_ + local_44 * (float)local_50;
          local_78 = local_78 + 1;
        }
        iVar8 = (int)local_a0 + (int)local_78;
        iVar9 = (int)local_100;
      }
      local_f0 = (long)((int)local_f0 * (int)local_90);
      for (; local_60 < local_f0; local_60 = local_60 + local_90) {
        iVar7 = (int)local_98;
        iVar6 = (int)local_60;
        local_34 = (float)(iVar7 + iVar6);
        local_40 = iVar6 - iVar7;
        auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_108[((int)local_148 + iVar6) * iVar9 +
                                                         local_114]),SUB6416(ZEXT464(0x40400000),0),
                                 ZEXT416((uint)local_7c));
        local_c8 = CONCAT44(local_c8._4_4_,auVar2._0_4_ * local_44);
        local_c0 = CONCAT44(local_c0._4_4_,iVar6 + -1);
        local_3c = (int)local_138 + iVar6;
        local_b8 = (bool *)CONCAT44(local_b8._4_4_,iVar7 + -1 + iVar6);
        local_a0 = CONCAT44(local_a0._4_4_,iVar8);
        local_a8 = local_128 + iVar8;
        local_b0 = (float *)(local_120 + iVar8);
        local_78 = 0;
        for (iVar8 = -1; iVar7 = local_40, piVar4 = local_e8, iVar6 = iVar8 + 1, iVar6 < local_6c;
            iVar8 = (int)local_90 + iVar8) {
          local_38 = (int)local_98 + 1 + iVar8;
          iVar16 = (int)local_b8;
          uStack_160 = 0x11e571;
          local_58._0_4_ = (float)((int)local_e0 + iVar8);
          fVar17 = box_integral_unconditional_opt
                             (local_e8,local_40,(int)local_110 + iVar8,(int)local_b8,
                              (int)uVar10 + 1 + iVar8);
          uStack_160 = 0x11e59a;
          local_50._0_4_ = fVar17;
          auVar20._0_4_ =
               box_integral_unconditional_opt
                         (piVar4,iVar7,(int)local_d0 + iVar8,iVar16,(int)local_d8 + iVar8);
          iVar16 = local_3c;
          auVar20._4_60_ = extraout_var_01;
          auVar2 = vfmadd132ss_fma(auVar20._0_16_,ZEXT416((uint)(float)local_50),ZEXT416(0xc0400000)
                                  );
          local_50 = CONCAT44(local_50._4_4_,auVar2._0_4_);
          local_88 = CONCAT44(local_88._4_4_,iVar6);
          iVar7 = (int)local_c0;
          uStack_160 = 0x11e5d1;
          fVar17 = box_integral_unconditional_opt(piVar4,local_3c,iVar6,(int)local_c0,local_38);
          iVar6 = (int)(float)local_58;
          uStack_160 = 0x11e5ef;
          local_68._0_4_ = fVar17;
          fVar17 = box_integral_unconditional_opt
                             (piVar4,(int)local_60,(int)(float)local_58,(int)local_34,iVar8);
          local_68 = CONCAT44(local_68._4_4_,fVar17 + (float)local_68);
          uStack_160 = 0x11e60d;
          fVar17 = box_integral_unconditional_opt(piVar4,iVar16,iVar6,iVar7,iVar8);
          uVar10 = local_f8;
          local_58 = CONCAT44(local_58._4_4_,(float)local_68 - fVar17);
          uStack_160 = 0x11e638;
          fVar17 = box_integral_unconditional_opt
                             (piVar4,(int)local_60,(int)local_88,(int)local_34,local_38);
          fVar17 = local_44 * ((float)local_58 - fVar17);
          auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar17 * -0.81)),
                                   ZEXT416((uint)(local_44 * (float)local_50)),
                                   ZEXT416((uint)(float)local_c8));
          local_a8[local_78] = auVar2._0_4_;
          *(bool *)((long)local_b0 + local_78) = 0.0 <= (float)local_c8 + local_44 * (float)local_50
          ;
          local_78 = local_78 + 1;
        }
        iVar8 = (int)local_a0 + (int)local_78;
        iVar9 = (int)local_100;
      }
    }
    return;
  }
  if (SBORROW4(uVar5,uVar14 * 2) == (int)(uVar5 + uVar14 * -2) < 0) {
    height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
    return;
  }
  height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional_opt(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_switch_Dyy_unconditional

        optimization:
        - box_integral_unconditional_opt instead of box_integral_unconditional
        - scalar replacement for more optimal flops count
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        // 2. Case The filter is somewhat larger than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image. Blue lines edition brings the switch into Dyy
            // Idea: Do compute_response_layer_Dyy_leftcorner
            // but everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO: fix this

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width*step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {
                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height * step; x += step) {

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;
                    t9 = x - lobe / 2 - 1;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral_unconditional_opt(iimage, t9, t6 + 1, t9 + lobe , t8 - 2);

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}